

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O1

void Llb_NonlinCutNodes_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  void **ppvVar2;
  uint uVar3;
  int iVar4;
  
  while( true ) {
    if (pObj->TravId == p->nTravIds) {
      return;
    }
    pObj->TravId = p->nTravIds;
    uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar3 = uVar1 & 7;
    if ((uVar3 != 3) || ((pObj->field_0).CioId < p->nTruePos)) break;
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  if (uVar3 == 1) {
    return;
  }
  if ((uVar1 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/llb/llb3Image.c"
                  ,0x1f2,"void Llb_NonlinCutNodes_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  Llb_NonlinCutNodes_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
  Llb_NonlinCutNodes_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vNodes);
  uVar1 = vNodes->nCap;
  if (vNodes->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar2;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar1 * 2;
      if (iVar4 <= (int)uVar1) goto LAB_008fb107;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
      }
      vNodes->pArray = ppvVar2;
    }
    vNodes->nCap = iVar4;
  }
LAB_008fb107:
  iVar4 = vNodes->nSize;
  vNodes->nSize = iVar4 + 1;
  vNodes->pArray[iVar4] = pObj;
  return;
}

Assistant:

void Llb_NonlinCutNodes_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Saig_ObjIsLi(p, pObj) )
    {
        Llb_NonlinCutNodes_rec(p, Aig_ObjFanin0(pObj), vNodes);
        return;
    }
    if ( Aig_ObjIsConst1(pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Llb_NonlinCutNodes_rec(p, Aig_ObjFanin0(pObj), vNodes);
    Llb_NonlinCutNodes_rec(p, Aig_ObjFanin1(pObj), vNodes);
    Vec_PtrPush( vNodes, pObj );
}